

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O1

void resolv_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  
  nni_mtx_lock(&resolv_mtx);
  pvVar2 = nni_aio_get_prov_data(aio);
  if (pvVar2 != arg) {
    nni_mtx_unlock(&resolv_mtx);
    return;
  }
  nni_aio_set_prov_data(aio,(void *)0x0);
  iVar1 = nni_aio_list_active(aio);
  if (iVar1 == 0) {
    if (0 < (long)resolv_num_thr) {
      lVar3 = 0;
      do {
        if (resolv_active[lVar3] == aio) {
          resolv_active[lVar3] = (nni_aio *)0x0;
          break;
        }
        lVar3 = lVar3 + 1;
      } while (resolv_num_thr != lVar3);
    }
  }
  else {
    nni_aio_list_remove(aio);
  }
  nni_mtx_unlock(&resolv_mtx);
  nni_aio_finish_error(aio,rv);
  return;
}

Assistant:

static void
resolv_cancel(nni_aio *aio, void *arg, int rv)
{
	nni_resolv_item *item = arg;

	nni_mtx_lock(&resolv_mtx);
	if (item != nni_aio_get_prov_data(aio)) {
		// Already canceled?
		nni_mtx_unlock(&resolv_mtx);
		return;
	}
	nni_aio_set_prov_data(aio, NULL);
	if (nni_aio_list_active(aio)) {
		// We have not been picked up by a resolver thread yet,
		// so we can just discard everything.
		nni_aio_list_remove(aio);
	} else {
		// Remove it from the thread pending list.  We cannot abort
		// the actual lookup, but this abandons interest in it, and
		// the resolver thread will pick the next item when done.
		for (int i = 0; i < resolv_num_thr; i++) {
			if (resolv_active[i] == aio) {
				resolv_active[i] = NULL;
				break;
			}
		}
	}
	nni_mtx_unlock(&resolv_mtx);
	nni_aio_finish_error(aio, rv);
}